

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_tracing_reorder.cpp
# Opt level: O3

spv_result_t
spvtools::val::ValidateHitObjectInstructionCommonParameters
          (ValidationState_t *_,Instruction *inst,uint32_t acceleration_struct_index,
          uint32_t instance_id_index,uint32_t primtive_id_index,uint32_t geometry_index,
          uint32_t ray_flags_index,uint32_t cull_mask_index,uint32_t hit_kind_index,
          uint32_t sbt_index,uint32_t sbt_offset_index,uint32_t sbt_stride_index,
          uint32_t sbt_record_offset_index,uint32_t sbt_record_stride_index,uint32_t miss_index,
          uint32_t ray_origin_index,uint32_t ray_tmin_index,uint32_t ray_direction_index,
          uint32_t ray_tmax_index,uint32_t payload_index,uint32_t hit_object_attr_index)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  uint32_t uVar4;
  uint uVar5;
  StorageClass SVar6;
  Instruction *pIVar7;
  long lVar8;
  char *pcVar9;
  DiagnosticStream local_200;
  
  if (acceleration_struct_index != 0xffffffff) {
    uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)acceleration_struct_index);
    OVar3 = ValidationState_t::GetIdOpcode(_,uVar2);
    if (OVar3 != OpTypeAccelerationStructureKHR) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = "Expected Acceleration Structure to be of type OpTypeAccelerationStructureKHR";
      lVar8 = 0x4c;
      goto LAB_002f7a41;
    }
  }
  if (instance_id_index != 0xffffffff) {
    uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)instance_id_index);
    bVar1 = ValidationState_t::IsIntScalarType(_,uVar2);
    if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = "Instance Id must be a 32-bit int scalar";
      lVar8 = 0x27;
      goto LAB_002f7a41;
    }
  }
  if (primtive_id_index != 0xffffffff) {
    uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)primtive_id_index);
    bVar1 = ValidationState_t::IsIntScalarType(_,uVar2);
    if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = "Primitive Id must be a 32-bit int scalar";
      lVar8 = 0x28;
      goto LAB_002f7a41;
    }
  }
  if (geometry_index != 0xffffffff) {
    uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)geometry_index);
    bVar1 = ValidationState_t::IsIntScalarType(_,uVar2);
    if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = "Geometry Index must be a 32-bit int scalar";
      lVar8 = 0x2a;
      goto LAB_002f7a41;
    }
  }
  if (miss_index != 0xffffffff) {
    uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)miss_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
    if ((bVar1) && (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 == 0x20))
    goto LAB_002f74a8;
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = "Miss Index must be a 32-bit int scalar";
LAB_002f7959:
    lVar8 = 0x26;
    goto LAB_002f7a41;
  }
LAB_002f74a8:
  if (cull_mask_index == 0xffffffff) {
LAB_002f74e8:
    if (sbt_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_index);
      bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
      if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "SBT Index must be a 32-bit unsigned int scalar";
        lVar8 = 0x2e;
        goto LAB_002f7a41;
      }
    }
    if (sbt_offset_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_offset_index);
      bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
      if ((bVar1) && (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 == 0x20))
      goto LAB_002f7568;
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = "SBT Offset must be a 32-bit unsigned int scalar";
LAB_002f79f5:
      lVar8 = 0x2f;
      goto LAB_002f7a41;
    }
LAB_002f7568:
    if (sbt_stride_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_stride_index);
      bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
      if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "SBT Stride must be a 32-bit unsigned int scalar";
        goto LAB_002f79f5;
      }
    }
    if (sbt_record_offset_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_record_offset_index);
      bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
      if ((bVar1) && (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 == 0x20))
      goto LAB_002f75e8;
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = "SBT record offset must be a 32-bit unsigned int scalar";
LAB_002f7a3c:
      lVar8 = 0x36;
      goto LAB_002f7a41;
    }
LAB_002f75e8:
    if (sbt_record_stride_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)sbt_record_stride_index);
      bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
      if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "SBT record stride must be a 32-bit unsigned int scalar";
        goto LAB_002f7a3c;
      }
    }
    if (ray_origin_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_origin_index);
      bVar1 = ValidationState_t::IsFloatVectorType(_,uVar2);
      if (((!bVar1) || (uVar4 = ValidationState_t::GetDimension(_,uVar2), uVar4 != 3)) ||
         (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "Ray Origin must be a 32-bit float 3-component vector";
        lVar8 = 0x34;
        goto LAB_002f7a41;
      }
    }
    if (ray_tmin_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_tmin_index);
      bVar1 = ValidationState_t::IsFloatScalarType(_,uVar2);
      if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "Ray TMin must be a 32-bit float scalar";
        goto LAB_002f7959;
      }
    }
    if (ray_direction_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_direction_index);
      bVar1 = ValidationState_t::IsFloatVectorType(_,uVar2);
      if (((!bVar1) || (uVar4 = ValidationState_t::GetDimension(_,uVar2), uVar4 != 3)) ||
         (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "Ray Direction must be a 32-bit float 3-component vector";
        lVar8 = 0x37;
        goto LAB_002f7a41;
      }
    }
    if (ray_tmax_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_tmax_index);
      bVar1 = ValidationState_t::IsFloatScalarType(_,uVar2);
      if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "Ray TMax must be a 32-bit float scalar";
        goto LAB_002f7959;
      }
    }
    if (ray_flags_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)ray_flags_index);
      bVar1 = ValidationState_t::IsIntScalarType(_,uVar2);
      if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "Ray Flags must be a 32-bit int scalar";
        goto LAB_002f7982;
      }
    }
    if (payload_index != 0xffffffff) {
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)payload_index);
      pIVar7 = ValidationState_t::FindDef(_,uVar5);
      if (((pIVar7->inst_).opcode != 0x3b) ||
         ((SVar6 = Instruction::GetOperandAs<spv::StorageClass>(pIVar7,2), SVar6 != RayPayloadKHR &&
          (SVar6 = Instruction::GetOperandAs<spv::StorageClass>(pIVar7,2),
          SVar6 != IncomingRayPayloadKHR)))) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = 
        "payload must be a OpVariable of storage class RayPayloadKHR or IncomingRayPayloadKHR";
        lVar8 = 0x54;
        goto LAB_002f7a41;
      }
    }
    if (hit_kind_index != 0xffffffff) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)hit_kind_index);
      bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
      if ((!bVar1) || (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "Hit Kind must be a 32-bit unsigned int scalar";
        lVar8 = 0x2d;
        goto LAB_002f7a41;
      }
    }
    if (hit_object_attr_index == 0xffffffff) {
      return SPV_SUCCESS;
    }
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)hit_object_attr_index);
    pIVar7 = ValidationState_t::FindDef(_,uVar5);
    if (((pIVar7->inst_).opcode == 0x3b) &&
       (SVar6 = Instruction::GetOperandAs<spv::StorageClass>(pIVar7,2),
       SVar6 == HitObjectAttributeNV)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = "Hit Object Attributes id must be a OpVariable of storage class HitObjectAttributeNV";
    lVar8 = 0x53;
  }
  else {
    uVar2 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)cull_mask_index);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
    if ((bVar1) && (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 == 0x20))
    goto LAB_002f74e8;
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = "Cull mask must be a 32-bit int scalar";
LAB_002f7982:
    lVar8 = 0x25;
  }
LAB_002f7a41:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar9,lVar8);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t ValidateHitObjectInstructionCommonParameters(
    ValidationState_t& _, const Instruction* inst,
    uint32_t acceleration_struct_index, uint32_t instance_id_index,
    uint32_t primtive_id_index, uint32_t geometry_index,
    uint32_t ray_flags_index, uint32_t cull_mask_index, uint32_t hit_kind_index,
    uint32_t sbt_index, uint32_t sbt_offset_index, uint32_t sbt_stride_index,
    uint32_t sbt_record_offset_index, uint32_t sbt_record_stride_index,
    uint32_t miss_index, uint32_t ray_origin_index, uint32_t ray_tmin_index,
    uint32_t ray_direction_index, uint32_t ray_tmax_index,
    uint32_t payload_index, uint32_t hit_object_attr_index) {
  auto isValidId = [](uint32_t spvid) { return spvid < KRayParamInvalidId; };
  if (isValidId(acceleration_struct_index) &&
      _.GetIdOpcode(_.GetOperandTypeId(inst, acceleration_struct_index)) !=
          spv::Op::OpTypeAccelerationStructureKHR) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Acceleration Structure to be of type "
              "OpTypeAccelerationStructureKHR";
  }

  if (isValidId(instance_id_index)) {
    const uint32_t instance_id = _.GetOperandTypeId(inst, instance_id_index);
    if (!_.IsIntScalarType(instance_id) || _.GetBitWidth(instance_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Instance Id must be a 32-bit int scalar";
    }
  }

  if (isValidId(primtive_id_index)) {
    const uint32_t primitive_id = _.GetOperandTypeId(inst, primtive_id_index);
    if (!_.IsIntScalarType(primitive_id) || _.GetBitWidth(primitive_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Primitive Id must be a 32-bit int scalar";
    }
  }

  if (isValidId(geometry_index)) {
    const uint32_t geometry_index_id = _.GetOperandTypeId(inst, geometry_index);
    if (!_.IsIntScalarType(geometry_index_id) ||
        _.GetBitWidth(geometry_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Geometry Index must be a 32-bit int scalar";
    }
  }

  if (isValidId(miss_index)) {
    const uint32_t miss_index_id = _.GetOperandTypeId(inst, miss_index);
    if (!_.IsUnsignedIntScalarType(miss_index_id) ||
        _.GetBitWidth(miss_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Miss Index must be a 32-bit int scalar";
    }
  }

  if (isValidId(cull_mask_index)) {
    const uint32_t cull_mask_id = _.GetOperandTypeId(inst, cull_mask_index);
    if (!_.IsUnsignedIntScalarType(cull_mask_id) ||
        _.GetBitWidth(cull_mask_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Cull mask must be a 32-bit int scalar";
    }
  }

  if (isValidId(sbt_index)) {
    const uint32_t sbt_index_id = _.GetOperandTypeId(inst, sbt_index);
    if (!_.IsUnsignedIntScalarType(sbt_index_id) ||
        _.GetBitWidth(sbt_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT Index must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(sbt_offset_index)) {
    const uint32_t sbt_offset_id = _.GetOperandTypeId(inst, sbt_offset_index);
    if (!_.IsUnsignedIntScalarType(sbt_offset_id) ||
        _.GetBitWidth(sbt_offset_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT Offset must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(sbt_stride_index)) {
    const uint32_t sbt_stride_index_id =
        _.GetOperandTypeId(inst, sbt_stride_index);
    if (!_.IsUnsignedIntScalarType(sbt_stride_index_id) ||
        _.GetBitWidth(sbt_stride_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT Stride must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(sbt_record_offset_index)) {
    const uint32_t sbt_record_offset_index_id =
        _.GetOperandTypeId(inst, sbt_record_offset_index);
    if (!_.IsUnsignedIntScalarType(sbt_record_offset_index_id) ||
        _.GetBitWidth(sbt_record_offset_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT record offset must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(sbt_record_stride_index)) {
    const uint32_t sbt_record_stride_index_id =
        _.GetOperandTypeId(inst, sbt_record_stride_index);
    if (!_.IsUnsignedIntScalarType(sbt_record_stride_index_id) ||
        _.GetBitWidth(sbt_record_stride_index_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "SBT record stride must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(ray_origin_index)) {
    const uint32_t ray_origin_id = _.GetOperandTypeId(inst, ray_origin_index);
    if (!_.IsFloatVectorType(ray_origin_id) ||
        _.GetDimension(ray_origin_id) != 3 ||
        _.GetBitWidth(ray_origin_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray Origin must be a 32-bit float 3-component vector";
    }
  }

  if (isValidId(ray_tmin_index)) {
    const uint32_t ray_tmin_id = _.GetOperandTypeId(inst, ray_tmin_index);
    if (!_.IsFloatScalarType(ray_tmin_id) || _.GetBitWidth(ray_tmin_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray TMin must be a 32-bit float scalar";
    }
  }

  if (isValidId(ray_direction_index)) {
    const uint32_t ray_direction_id =
        _.GetOperandTypeId(inst, ray_direction_index);
    if (!_.IsFloatVectorType(ray_direction_id) ||
        _.GetDimension(ray_direction_id) != 3 ||
        _.GetBitWidth(ray_direction_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray Direction must be a 32-bit float 3-component vector";
    }
  }

  if (isValidId(ray_tmax_index)) {
    const uint32_t ray_tmax_id = _.GetOperandTypeId(inst, ray_tmax_index);
    if (!_.IsFloatScalarType(ray_tmax_id) || _.GetBitWidth(ray_tmax_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray TMax must be a 32-bit float scalar";
    }
  }

  if (isValidId(ray_flags_index)) {
    const uint32_t ray_flags_id = _.GetOperandTypeId(inst, ray_flags_index);
    if (!_.IsIntScalarType(ray_flags_id) || _.GetBitWidth(ray_flags_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Ray Flags must be a 32-bit int scalar";
    }
  }

  if (isValidId(payload_index)) {
    const uint32_t payload_id = inst->GetOperandAs<uint32_t>(payload_index);
    auto variable = _.FindDef(payload_id);
    const auto var_opcode = variable->opcode();
    if (!variable || var_opcode != spv::Op::OpVariable ||
        (variable->GetOperandAs<spv::StorageClass>(2) !=
             spv::StorageClass::RayPayloadKHR &&
         variable->GetOperandAs<spv::StorageClass>(2) !=
             spv::StorageClass::IncomingRayPayloadKHR)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "payload must be a OpVariable of storage "
                "class RayPayloadKHR or IncomingRayPayloadKHR";
    }
  }

  if (isValidId(hit_kind_index)) {
    const uint32_t hit_kind_id = _.GetOperandTypeId(inst, hit_kind_index);
    if (!_.IsUnsignedIntScalarType(hit_kind_id) ||
        _.GetBitWidth(hit_kind_id) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Hit Kind must be a 32-bit unsigned int scalar";
    }
  }

  if (isValidId(hit_object_attr_index)) {
    const uint32_t hit_object_attr_id =
        inst->GetOperandAs<uint32_t>(hit_object_attr_index);
    auto variable = _.FindDef(hit_object_attr_id);
    const auto var_opcode = variable->opcode();
    if (!variable || var_opcode != spv::Op::OpVariable ||
        (variable->GetOperandAs<spv::StorageClass>(2)) !=
            spv::StorageClass::HitObjectAttributeNV) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Hit Object Attributes id must be a OpVariable of storage "
                "class HitObjectAttributeNV";
    }
  }

  return SPV_SUCCESS;
}